

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPML_TAGGED_POLICY_Unmarshal(TPML_TAGGED_POLICY *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT32 UVar2;
  TPM_RC TVar3;
  ulong uVar4;
  TPMS_TAGGED_POLICY *target_00;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar3 = 0x9a;
  if (3 < iVar1) {
    UVar2 = ByteArrayToUint32(*buffer);
    target->count = UVar2;
    *buffer = *buffer + 4;
    uVar4 = (ulong)target->count;
    TVar3 = 0x84;
    if (uVar4 < 0xf) {
      TVar3 = 0;
      if (uVar4 != 0) {
        target_00 = target->policies;
        do {
          TVar3 = TPMS_TAGGED_POLICY_Unmarshal(target_00,buffer,size);
          if (TVar3 != 0) {
            return TVar3;
          }
          target_00 = target_00 + 1;
          uVar4 = uVar4 - 1;
          TVar3 = 0;
        } while (uVar4 != 0);
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPML_TAGGED_POLICY_Unmarshal(TPML_TAGGED_POLICY *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->count) > MAX_TAGGED_POLICIES)
        return TPM_RC_VALUE;
    result = TPMS_TAGGED_POLICY_Array_Unmarshal((TPMS_TAGGED_POLICY *)(target->policies), buffer, size, (INT32)(target->count));
    return result;
}